

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.hh
# Opt level: O0

void __thiscall Game::load_maze(Game *this)

{
  value_type vVar1;
  int iVar2;
  byte bVar3;
  istream *this_00;
  size_type sVar4;
  size_type __n;
  vector<char,_std::allocator<char>_> *pvVar5;
  reference pvVar6;
  reference this_01;
  reference pvVar7;
  value_type this_02;
  pair<std::__detail::_Node_iterator<int,_true,_false>,_bool> pVar8;
  param_type local_3b8;
  value_type local_3b0;
  Position local_3a8;
  Ghost_State local_3a0;
  Position local_35c;
  Agent_State local_354;
  Position local_338;
  Position local_330;
  _Node_iterator_base<int,_false> local_328;
  undefined1 local_320;
  value_type local_314;
  _Node_iterator_base<int,_false> local_310;
  undefined1 local_308;
  value_type local_2fc;
  _Node_iterator_base<int,_false> local_2f8;
  undefined1 local_2f0;
  value_type local_2e4;
  char local_2dd;
  int local_2dc;
  char cell;
  int j;
  allocator<std::vector<int,_std::allocator<int>_>_> local_2ce;
  char dummy;
  int i;
  vector<int,_std::allocator<int>_> local_2c8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_2b0;
  int local_294;
  uint valid_index;
  uint local_270;
  uint local_26c;
  int cols;
  int rows;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_218 [8];
  ifstream maze_file;
  Game *this_local;
  
  this->loaded_maze = true;
  std::ifstream::ifstream(local_218);
  std::ifstream::open(local_218,0x14f588);
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cols,
                   "Invalid maze file path \'",&Arguments::maze_path_abi_cxx11_);
    std::operator+(&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cols,"\'");
    error(&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&cols);
  }
  this_00 = (istream *)std::istream::operator>>((istream *)local_218,(int *)&local_26c);
  std::istream::operator>>(this_00,(int *)&local_270);
  Matrix<char>::Matrix((Matrix<char> *)&stack0xfffffffffffffd70,local_26c,local_270,'\0');
  Matrix<char>::operator=(&(this->state).maze,(Matrix<char> *)&stack0xfffffffffffffd70);
  Matrix<char>::~Matrix((Matrix<char> *)&stack0xfffffffffffffd70);
  local_294 = 0;
  sVar4 = (size_type)(int)local_26c;
  __n = (size_type)(int)local_270;
  i = -1;
  std::allocator<int>::allocator((allocator<int> *)&dummy);
  std::vector<int,_std::allocator<int>_>::vector(&local_2c8,__n,&i,(allocator<int> *)&dummy);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_2ce);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_2b0,sVar4,&local_2c8,&local_2ce);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=(&PathMagic::index_from_pos,&local_2b0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_2b0);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_2ce);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2c8);
  std::allocator<int>::~allocator((allocator<int> *)&dummy);
  std::vector<Position,_std::allocator<Position>_>::clear(&State::valid_positions);
  std::vector<Position,_std::allocator<Position>_>::clear(&State::valid_positions_no_spawn);
  std::istream::operator>>((istream *)local_218,std::noskipws);
  for (j = 0; j < (int)local_26c; j = j + 1) {
    std::operator>>((istream *)local_218,&cell);
    for (local_2dc = 0; local_2dc < (int)local_270; local_2dc = local_2dc + 1) {
      std::operator>>((istream *)local_218,&local_2dd);
      if ((local_2dd == 'P') || (vVar1 = local_2dd, local_2dd == 'G')) {
        vVar1 = ' ';
      }
      pvVar5 = Matrix<char>::operator[](&(this->state).maze,j);
      pvVar6 = std::vector<char,_std::allocator<char>_>::operator[](pvVar5,(long)local_2dc);
      *pvVar6 = vVar1;
      (this->state).n_normal_pills_left =
           (uint)(local_2dd == '.') + (this->state).n_normal_pills_left;
      (this->state).n_powerpills_left = (uint)(local_2dd == 'o') + (this->state).n_powerpills_left;
      if (local_2dd == 'o') {
        sVar4 = std::vector<Position,_std::allocator<Position>_>::size(&State::valid_positions);
        local_2e4 = (value_type)sVar4;
        pVar8 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
                insert(&(this->state).powerpills,&local_2e4);
        local_2f8._M_cur = (__node_type *)pVar8.first.super__Node_iterator_base<int,_false>._M_cur;
        local_2f0 = pVar8.second;
        sVar4 = std::vector<Position,_std::allocator<Position>_>::size(&State::valid_positions);
        local_2fc = (value_type)sVar4;
        pVar8 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
                insert(&(this->state).pills,&local_2fc);
        local_310._M_cur = (__node_type *)pVar8.first.super__Node_iterator_base<int,_false>._M_cur;
        local_308 = pVar8.second;
      }
      else if (local_2dd == '.') {
        sVar4 = std::vector<Position,_std::allocator<Position>_>::size(&State::valid_positions);
        local_314 = (value_type)sVar4;
        pVar8 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
                insert(&(this->state).pills,&local_314);
        local_328._M_cur = (__node_type *)pVar8.first.super__Node_iterator_base<int,_false>._M_cur;
        local_320 = pVar8.second;
      }
      if (local_2dd != '%') {
        Position::Position(&local_330,j,local_2dc);
        std::vector<Position,_std::allocator<Position>_>::push_back
                  (&State::valid_positions,&local_330);
        if ((local_2dd != 'X') && (local_2dd != 'G')) {
          Position::Position(&local_338,j,local_2dc);
          std::vector<Position,_std::allocator<Position>_>::push_back
                    (&State::valid_positions_no_spawn,&local_338);
        }
        iVar2 = local_294;
        local_294 = local_294 + 1;
        this_01 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](&PathMagic::index_from_pos,(long)j);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_2dc);
        *pvVar7 = iVar2;
      }
      if (local_2dd == 'P') {
        Position::Position(&local_35c,j,local_2dc);
        Agent_State::Agent_State(&local_354,&local_35c,&Direction::UP);
        Agent_State::operator=(&(this->state).pacman,&local_354);
      }
      else if (local_2dd == 'G') {
        pvVar5 = Matrix<char>::operator[](&(this->state).maze,j);
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[](pvVar5,(long)local_2dc);
        *pvVar6 = 'X';
        Position::Position(&local_3a8,j,local_2dc);
        Ghost_State::Ghost_State(&local_3a0,&local_3a8,&Direction::UP);
        std::vector<Ghost_State,_std::allocator<Ghost_State>_>::push_back
                  (&(this->state).ghosts,&local_3a0);
        this_02 = (value_type)operator_new(8);
        ((Agent *)&this_02->_vptr_Agent)->_vptr_Agent = (_func_int **)0x0;
        Ghost_Agent::Ghost_Agent((Ghost_Agent *)this_02);
        local_3b0 = this_02;
        std::vector<Agent_*,_std::allocator<Agent_*>_>::push_back(&this->ghosts,&local_3b0);
      }
    }
  }
  State::total_pills = (this->state).n_normal_pills_left + (this->state).n_powerpills_left;
  State::total_powerpills = (this->state).n_powerpills_left;
  State::total_normal_pills = (this->state).n_normal_pills_left;
  sVar4 = std::vector<Position,_std::allocator<Position>_>::size(&State::valid_positions_no_spawn);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&local_3b8,0,(int)sVar4 + -1);
  State::distribution_valid_pos_no_spawn._M_param = local_3b8;
  sVar4 = std::vector<Ghost_State,_std::allocator<Ghost_State>_>::size(&(this->state).ghosts);
  State::n_ghosts = (int)sVar4;
  SeenMatrix::init((SeenMatrix *)(ulong)local_26c,(EVP_PKEY_CTX *)(ulong)local_270);
  PathMagic::compute(&this->state);
  RL_Pacman_Agent_Inputs::precompute();
  State::operator=(&this->initialState,&this->state);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void load_maze() {
        loaded_maze = true;

        ifstream maze_file;
        maze_file.open(Arguments::maze_path);

        if (not maze_file.is_open())
            error("Invalid maze file path '" + Arguments::maze_path + "'");

        int rows, cols;
        maze_file >> rows >> cols;
        state.maze = Matrix<char>(rows, cols);
        uint valid_index = 0;
        PathMagic::index_from_pos = vector<vector<int>>(rows, vector<int>(cols, -1));
        State::valid_positions.clear();
        State::valid_positions_no_spawn.clear();

        maze_file >> std::noskipws;
        for (int i = 0; i < rows; ++i) {
            char dummy; maze_file >> dummy;
            for (int j = 0; j < cols; ++j) {
                char cell; maze_file >> cell;
                state.maze[i][j] = cell != State::PACMAN and cell != State::GHOST ? cell : State::FREE;

                state.n_normal_pills_left += cell == State::PILL;
                state.n_powerpills_left += cell == State::POWER_PILL;

                if (cell == State::POWER_PILL) {
                    state.powerpills.insert(state.valid_positions.size());
                    state.pills.insert(state.valid_positions.size());
                }
                else if (cell == State::PILL) {
                    state.pills.insert(state.valid_positions.size());
                }

                if (cell != State::WALL) {
                    state.valid_positions.push_back(Position(i, j));
                    if (cell != State::SPAWN_AREA and cell != State::GHOST) state.valid_positions_no_spawn.push_back(Position(i, j));
                    PathMagic::index_from_pos[i][j] = valid_index++;
                }

                if (cell == State::PACMAN) state.pacman = Agent_State(Position(i, j), Direction::UP);
                else if (cell == State::GHOST) {
                    state.maze[i][j] = State::SPAWN_AREA;
                    state.ghosts.push_back(Ghost_State(Position(i, j), Direction::UP));
                    ghosts.push_back((Agent*)new Ghost_Agent());
                }
            }
        }

        state.total_pills = state.n_normal_pills_left + state.n_powerpills_left;
        state.total_powerpills = state.n_powerpills_left;
        state.total_normal_pills = state.n_normal_pills_left;
        state.distribution_valid_pos_no_spawn = uniform_int_distribution<>(0, state.valid_positions_no_spawn.size() - 1);
        state.n_ghosts = state.ghosts.size();

        SeenMatrix::init(rows, cols);
        PathMagic::compute(state);
        RL_Pacman_Agent_Inputs::precompute();

        initialState = state;
    }